

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<14,_2,_5,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float afStack_3c [5];
  undefined4 local_28;
  float fStack_24;
  undefined4 uStack_20;
  float fStack_1c;
  int aiStack_18 [6];
  
  auVar2 = *(undefined1 (*) [16])evalCtx->in[0].m_data;
  auVar3 = *(undefined1 (*) [16])evalCtx->in[1].m_data;
  auVar2 = divps(auVar2,auVar2);
  auVar3 = divps(auVar3,auVar3);
  uStack_20 = auVar3._0_4_;
  fStack_24 = auVar2._4_4_;
  fStack_1c = auVar3._4_4_;
  local_28 = auVar2._0_4_;
  afStack_3c[2] = (float)local_28;
  afStack_3c[3] = (float)uStack_20;
  afStack_3c[4] = fStack_24 + fStack_1c;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_3c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) / b(row, col);
	return res;
}